

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_long>::on_oct
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_long>
           *this)

{
  uint uVar1;
  basic_format_specs<char> *specs;
  bool bVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar3;
  ulong uVar4;
  int num_digits;
  string_view prefix;
  write_int_data<char> data;
  write_int_data<char> local_70;
  anon_class_48_3_ff6d91eb local_60;
  
  num_digits = 0;
  uVar4 = this->abs_value;
  do {
    num_digits = num_digits + 1;
    bVar2 = 7 < uVar4;
    uVar4 = uVar4 >> 3;
  } while (bVar2);
  specs = this->specs;
  if (((char)specs->field_0x9 < '\0') && (this->abs_value != 0 && specs->precision <= num_digits)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  bVar3.container = (this->out).container;
  uVar1 = this->prefix_size;
  prefix.size_._0_4_ = uVar1;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_70,num_digits,prefix,specs);
  local_60.data.size = local_70.size;
  local_60.data.padding = local_70.padding;
  local_60.prefix.data_ = this->prefix;
  local_60.prefix.size_ = (ulong)uVar1;
  local_60.f.this =
       (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
        *)this;
  local_60.f.num_digits = num_digits;
  bVar3 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_int<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned_long>::on_oct()::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,int,fmt::v7::basic_string_view<char>,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned_long>::on_oct()::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_&>
                    (bVar3,specs,local_70.size,local_70.size,&local_60);
  (this->out).container = bVar3.container;
  return;
}

Assistant:

void on_oct() {
    int num_digits = count_digits<3>(abs_value);
    if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
      // Octal prefix '0' is counted as a digit, so only add it if precision
      // is not greater than the number of digits.
      prefix[prefix_size++] = '0';
    }
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<3, Char>(it, abs_value, num_digits);
                    });
  }